

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_types.h
# Opt level: O1

void __thiscall Clasp::SequentialSolve::doStop(SequentialSolve *this)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)((this->solve_).ptr_ & 0xfffffffffffffffe);
  if (puVar1 != (undefined8 *)0x0) {
    Enumerator::end((Enumerator *)((this->super_SolveAlgorithm).enum_.ptr_ & 0xfffffffffffffffe),
                    (Solver *)*puVar1);
    SingleOwnerPtr<Clasp::BasicSolve,_Clasp::DeleteObject>::reset(&this->solve_,(BasicSolve *)0x0);
    return;
  }
  return;
}

Assistant:

T*   get()        const { return (T*)clear_bit(ptr_, 0); }